

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Response>::~ExceptionOr
          (ExceptionOr<kj::HttpInputStream::Response> *this)

{
  AsyncInputStream *pAVar1;
  Disposer *pDVar2;
  
  if (((this->value).ptr.isSet == true) &&
     (pAVar1 = (this->value).ptr.field_1.value.body.ptr, pAVar1 != (AsyncInputStream *)0x0)) {
    (this->value).ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
    pDVar2 = (this->value).ptr.field_1.value.body.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pAVar1->_vptr_AsyncInputStream[-2] + (long)&pAVar1->_vptr_AsyncInputStream);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;